

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::permute_axes(CImg<unsigned_int> *this,char *order)

{
  CImg<unsigned_int> *pCVar1;
  CImg<unsigned_int> local_30;
  
  get_permute_axes(&local_30,this,order);
  pCVar1 = move_to(&local_30,this);
  ~CImg(&local_30);
  return pCVar1;
}

Assistant:

CImg<T>& permute_axes(const char *const order) {
      return get_permute_axes(order).move_to(*this);
    }